

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t JenkinsOOAT_perl(char *key,int len,uint32_t hash)

{
  byte *pbVar1;
  uint uVar2;
  
  pbVar1 = (byte *)(key + len);
  for (; key < pbVar1; key = (char *)((byte *)key + 1)) {
    uVar2 = (hash + (byte)*key) * 0x401;
    hash = uVar2 >> 6 ^ uVar2;
  }
  return (hash * 9 >> 0xb ^ hash * 9) * 0x8001;
}

Assistant:

uint32_t JenkinsOOAT_perl(const char *key, int len, uint32_t hash)
{
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  while (str < end) {
    hash += *str++;
    hash += (hash << 10);
    hash ^= (hash >> 6);
  }
  hash += (hash << 3);
  hash ^= (hash >> 11);
  hash = hash + (hash << 15);
  return hash;
}